

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser::parseMetadata(Parser *this,QString *data,qsizetype offset,QStringList *includes)

{
  storage_type_conflict *psVar1;
  storage_type_conflict *psVar2;
  QArrayData *data_00;
  char16_t *pcVar3;
  Function *data_01;
  Data *pDVar4;
  Data *pDVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  qsizetype qVar15;
  QList<QString> *this_00;
  qsizetype qVar16;
  qsizetype qVar17;
  qlonglong qVar18;
  iterator iVar19;
  iterator iVar20;
  pointer pQVar21;
  iterator iVar22;
  iterator iVar23;
  long lVar24;
  QString *str;
  QString *str_00;
  QString *pQVar25;
  long lVar26;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar28;
  qsizetype in_R8;
  QString *value;
  iterator __i;
  EnumNameValue *pEVar29;
  iterator iVar30;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView string;
  QStringView string_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QStringView lhs_09;
  QStringView lhs_10;
  QStringView lhs_11;
  QStringView lhs_12;
  QStringView lhs_13;
  QStringView lhs_14;
  QStringView lhs_15;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QStringView rhs_07;
  QStringView rhs_08;
  QStringView rhs_09;
  QStringView rhs_10;
  QStringView rhs_11;
  QStringView rhs_12;
  QStringView rhs_13;
  QStringView rhs_14;
  QStringView rhs_15;
  QStringView str_01;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QAnyStringView a_02;
  QAnyStringView a_03;
  QStringView str_02;
  QList<EnumNameValue> ret;
  QRegularExpressionMatch rm;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression macro;
  QRegularExpressionMatchIterator r;
  QRegularExpression rangeMacro;
  long local_2a0;
  QString local_258 [3];
  QString local_210;
  QArrayDataPointer<EnumNameValue> local_1f8;
  QArrayDataPointer<QString> local_1d8;
  QString local_1b8;
  QString local_198;
  QArrayDataPointer<QString> local_178;
  QString local_160;
  QString local_148;
  QRegularExpressionMatch local_130;
  QRegularExpression local_128;
  undefined1 local_120 [16];
  undefined1 *puStack_110;
  undefined1 *local_108;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  undefined1 local_78 [64];
  long local_38;
  Parser *pPVar27;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = (data->d).ptr;
  local_78._8_8_ = (data->d).size;
  uVar13 = QStringView::indexOf((QStringView *)local_78,(QChar)0x28,offset,CaseSensitive);
  local_78._0_8_ = (data->d).ptr;
  local_78._8_8_ = (data->d).size;
  uVar14 = QStringView::indexOf((QStringView *)local_78,(QChar)0x2c,uVar13,CaseSensitive);
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid((QString *)local_78,data,uVar13 + 1,~uVar13 + uVar14);
  QString::simplified_helper(&local_f8,(QString *)local_78,str);
  if ((Function *)local_78._0_8_ != (Function *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_78._0_8_)->d).d = *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  psVar1 = (storage_type_conflict *)(this->m_provider).d.size;
  if (((storage_type_conflict *)local_f8.d.size == psVar1) &&
     (lhs.m_size = (qsizetype)(this->m_provider).d.ptr,
     lhs.m_data = (storage_type_conflict *)local_f8.d.size, rhs.m_size = in_R8, rhs.m_data = psVar1,
     bVar8 = QtPrivate::equalStrings((QtPrivate *)local_f8.d.ptr,lhs,rhs), bVar8)) {
    local_78._0_8_ = (data->d).ptr;
    local_78._8_8_ = (data->d).size;
    qVar15 = QStringView::indexOf((QStringView *)local_78,(QChar)0x29,uVar14 + 1,CaseSensitive);
    QString::mid((QString *)&local_98,data,uVar14 + 1,~uVar14 + qVar15);
    QString::simplified_helper((QString *)local_78,(QString *)&local_98,str_00);
    uVar7 = local_78._16_8_;
    uVar6 = local_78._0_8_;
    pcVar3 = local_d8.d.ptr;
    pDVar4 = local_d8.d.d;
    local_78._0_8_ = local_d8.d.d;
    local_d8.d.d = (Data *)uVar6;
    local_d8.d.ptr = (char16_t *)local_78._8_8_;
    local_78._8_8_ = pcVar3;
    local_78._16_8_ = local_d8.d.size;
    local_d8.d.size = uVar7;
    if ((Function *)pDVar4 != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d =
           *(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
    if ((Function *)local_98.d != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_120._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    preprocessMetadata((QString *)(local_120 + 8),&local_d8);
    local_120._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = (Function *)0x0;
    local_78._8_8_ = L"([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;";
    local_78._16_8_ = (storage_type_conflict *)0x38;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)local_120,(QString *)local_78,(PatternOptions)0x0);
    if ((Function *)local_78._0_8_ != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_78._0_8_)->d).d = *(int *)&(((QString *)local_78._0_8_)->d).d + -1
      ;
      UNLOCK();
      if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    local_128.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    local_2a0 = 0;
    qVar15 = 0;
    QRegularExpression::globalMatch
              (&local_128,(QString *)local_120,(qsizetype)(local_120 + 8),NormalMatch,
               (MatchOptions)0x0);
    bVar8 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_128);
    if (bVar8) {
      this_00 = &this->m_metadata;
      local_2a0 = 0;
      do {
        local_130.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_130);
        local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured((QString *)local_78,&local_130,2);
        QString::trimmed_helper(&local_148,(QString *)local_78);
        if ((Function *)local_78._0_8_ != (Function *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_78._0_8_)->d).d =
               *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
        qVar16 = QRegularExpressionMatch::capturedStart(&local_130,0);
        lVar24 = (int)qVar16 - local_2a0;
        if (lVar24 != 0 && local_2a0 <= (int)qVar16) {
          QString::mid((QString *)local_78,(QString *)(local_120 + 8),local_2a0,lVar24);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)this_00,(this->m_metadata).d.size,
                     (QString *)local_78);
          QList<QString>::end(this_00);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
        }
        qVar16 = QRegularExpressionMatch::capturedEnd(&local_130,0);
        if ((undefined1 *)local_148.d.size == (undefined1 *)0x0) {
          bVar8 = true;
        }
        else {
          local_160.d.d = (Data *)0x0;
          local_160.d.ptr = L"AUTO";
          local_160.d.size = 4;
          bVar8 = QString::startsWith(&local_148,&local_160,CaseSensitive);
          if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (bVar8 == false) {
          QRegularExpressionMatch::captured((QString *)local_78,&local_130,0);
          str_01.m_size = 1;
          str_01.m_data = (storage_type_conflict *)local_78._16_8_;
          bVar8 = QtPrivate::QStringList_contains
                            ((QtPrivate *)this_00,(QStringList *)local_78._8_8_,str_01,
                             (CaseSensitivity)qVar15);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          if (!bVar8) {
            QRegularExpressionMatch::captured((QString *)local_78,&local_130,0);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)this_00,(this->m_metadata).d.size,
                       (QString *)local_78);
            QList<QString>::end(this_00);
            if ((Function *)local_78._0_8_ != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_78._0_8_)->d).d =
                   *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
          }
        }
        else {
          QString::replace(&local_148,(QChar)0xa,(QChar)0x20,CaseSensitive);
          local_178.d = (Data *)0x0;
          local_178.ptr = (QString *)0x0;
          local_178.size = 0;
          local_78._0_8_ = (Function *)0x0;
          local_78._8_8_ = L"RANGE";
          local_78._16_8_ = (storage_type_conflict *)0x5;
          qVar17 = QString::indexOf(&local_148,(QString *)local_78,0,CaseSensitive);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          if (qVar17 != -1) {
            local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = (Function *)0x0;
            local_78._8_8_ = L"RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)";
            local_78._16_8_ = (storage_type_conflict *)0x2c;
            QRegularExpression::QRegularExpression
                      ((QRegularExpression *)&local_98,(QString *)local_78,(PatternOptions)0x0);
            if ((Function *)local_78._0_8_ != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_78._0_8_)->d).d =
                   *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
            local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            qVar15 = 0;
            QRegularExpression::globalMatch
                      ((QRegularExpression *)&local_b8,(QString *)&local_98,(qsizetype)&local_148,
                       NormalMatch,(MatchOptions)0x0);
            while (bVar8 = QRegularExpressionMatchIterator::hasNext
                                     ((QRegularExpressionMatchIterator *)&local_b8), bVar8) {
              local_198.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_198);
              QRegularExpressionMatch::captured
                        ((QString *)local_78,(QRegularExpressionMatch *)&local_198,1);
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_178,local_178.size,(QString *)local_78)
              ;
              QList<QString>::end((QList<QString> *)&local_178);
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              QRegularExpressionMatch::captured
                        ((QString *)local_78,(QRegularExpressionMatch *)&local_198,2);
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_178,local_178.size,(QString *)local_78)
              ;
              QList<QString>::end((QList<QString> *)&local_178);
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              QRegularExpressionMatch::~QRegularExpressionMatch
                        ((QRegularExpressionMatch *)&local_198);
            }
            QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                      ((QRegularExpressionMatchIterator *)&local_b8);
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
          }
          local_198.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_198.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_198.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured(&local_198,&local_130,1);
          local_1b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured(&local_1b8,&local_130,3);
          pPVar27 = (Parser *)local_198.d.size;
          if ((Parser *)local_198.d.size == (Parser *)0x5) {
            lhs_00.m_size = (qsizetype)L"FLAGS";
            lhs_00.m_data = (storage_type_conflict *)0x5;
            rhs_00.m_size = qVar15;
            rhs_00.m_data = (storage_type_conflict *)0x5;
            bVar8 = QtPrivate::equalStrings((QtPrivate *)local_198.d.ptr,lhs_00,rhs_00);
          }
          else {
            bVar8 = false;
          }
          local_1d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          findEnumValues((QStringList *)&local_1d8,pPVar27,&local_1b8,includes);
          if (((storage_type_conflict *)local_1d8.size == (storage_type_conflict *)0x0) &&
             (bVar8 != false)) {
            aVar28 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x73;
            bVar9 = QString::endsWith(&local_1b8,(QChar)0x73,CaseSensitive);
            if (bVar9) {
              if ((storage_type_conflict *)local_1b8.d.size == (storage_type_conflict *)0x0) {
                local_b8.d.d = local_1b8.d.d;
                local_b8.d.ptr = local_1b8.d.ptr;
                local_b8.d.size = local_1b8.d.size;
                if ((Function *)local_1b8.d.d != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d + 1;
                  UNLOCK();
                }
              }
              else {
                aVar28.m_data_utf16 = local_1b8.d.ptr;
                QString::QString(&local_b8,(QChar *)local_1b8.d.ptr,
                                 (qsizetype)(local_1b8.d.size + -1));
              }
              findEnumValues((QStringList *)&local_98,(Parser *)aVar28.m_data,&local_b8,includes);
              qVar17 = local_98.size;
              pQVar25 = local_98.ptr;
              pDVar5 = local_98.d;
              local_78._16_8_ = local_1d8.size;
              local_78._8_8_ = local_1d8.ptr;
              local_78._0_8_ = local_1d8.d;
              local_98.d = (Data *)0x0;
              local_98.ptr = (QString *)0x0;
              local_98.size = 0;
              local_1d8.d = pDVar5;
              local_1d8.ptr = pQVar25;
              local_1d8.size = qVar17;
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78)
              ;
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
              if ((Function *)local_b8.d.d != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          if ((storage_type_conflict *)local_1d8.size != (storage_type_conflict *)0x0) {
            local_1f8.d = (Data *)0x0;
            local_1f8.ptr = (EnumNameValue *)0x0;
            local_1f8.size = 0;
            pPVar27 = (Parser *)((long)local_1d8.ptr + local_1d8.size * 0x18);
            iVar11 = 0;
            aVar28 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_1d8.ptr;
            do {
              local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_78._0_8_ = (Function *)0x0;
              local_78._8_8_ = (Parser *)0x0;
              local_78._16_8_ = (storage_type_conflict *)0x0;
              local_78._24_8_ = (QArrayData *)0x0;
              local_78._32_8_ = (char16_t *)0x0;
              local_78._40_8_ = 0;
              local_98.d = *(Data **)((long)aVar28.m_data + 8);
              local_98.ptr = *(QString **)((long)aVar28.m_data + 0x10);
              qVar17 = QStringView::indexOf((QStringView *)&local_98,(QChar)0x3d,0,CaseSensitive);
              if (qVar17 == -1) {
                bVar9 = QString::endsWith((QString *)aVar28.m_data,(QChar)0x2c,CaseSensitive);
                if (bVar9) {
                  QString::left((QString *)&local_98,(QString *)aVar28.m_data,
                                *(qsizetype *)((long)aVar28.m_data + 0x10) + -1);
                  uVar7 = local_78._8_8_;
                  uVar6 = local_78._0_8_;
                  qVar17 = local_98.size;
                  pDVar5 = local_98.d;
                  local_98.d = (Data *)local_78._0_8_;
                  local_78._0_8_ = pDVar5;
                  local_78._8_8_ = local_98.ptr;
                  local_98.ptr = (QString *)uVar7;
                  local_98.size = local_78._16_8_;
                  local_78._16_8_ = qVar17;
                  if ((Function *)uVar6 != (Function *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                    }
                  }
                }
                else {
                  QString::operator=((QString *)local_78,(QString *)aVar28.m_data);
                }
                iVar11 = iVar11 + 1;
                local_78._48_4_ = iVar11;
                QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
                          ((QGenericArrayOps<EnumNameValue> *)&local_1f8,local_1f8.size,
                           (EnumNameValue *)local_78);
                QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
              }
              else {
                local_98.d = *(Data **)((long)aVar28.m_data + 8);
                local_98.ptr = *(QString **)((long)aVar28.m_data + 0x10);
                uVar13 = QStringView::indexOf((QStringView *)&local_98,(QChar)0x3d,0,CaseSensitive);
                QString::left(&local_b8,(QString *)aVar28.m_data,uVar13);
                QString::trimmed_helper((QString *)&local_98,&local_b8);
                uVar7 = local_78._8_8_;
                uVar6 = local_78._0_8_;
                qVar17 = local_98.size;
                pDVar5 = local_98.d;
                local_98.d = (Data *)local_78._0_8_;
                local_78._0_8_ = pDVar5;
                local_78._8_8_ = local_98.ptr;
                local_98.ptr = (QString *)uVar7;
                local_98.size = local_78._16_8_;
                local_78._16_8_ = qVar17;
                if ((Function *)uVar6 != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                  }
                }
                if ((Function *)local_b8.d.d != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                QString::right(&local_b8,(QString *)aVar28.m_data,
                               ~uVar13 + *(qsizetype *)((long)aVar28.m_data + 0x10));
                QString::trimmed_helper((QString *)&local_98,&local_b8);
                if ((Function *)local_b8.d.d != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                bVar9 = QString::endsWith((QString *)&local_98,(QChar)0x2c,CaseSensitive);
                if (bVar9) {
                  if ((storage_type_conflict *)local_98.size == (storage_type_conflict *)0x0) {
                    local_b8.d.d = (Data *)local_98.d;
                    local_b8.d.ptr = (char16_t *)local_98.ptr;
                    local_b8.d.size = local_98.size;
                    if ((Function *)local_98.d != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                           *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + 1;
                      UNLOCK();
                    }
                  }
                  else {
                    QString::QString(&local_b8,(QChar *)local_98.ptr,(qsizetype)(local_98.size + -1)
                                    );
                  }
                  pQVar25 = local_98.ptr;
                  pDVar5 = local_98.d;
                  qVar17 = local_b8.d.size;
                  pDVar4 = local_b8.d.d;
                  local_b8.d.d = (Data *)local_98.d;
                  local_98.d = (Data *)pDVar4;
                  local_98.ptr = (QString *)local_b8.d.ptr;
                  local_b8.d.ptr = (char16_t *)pQVar25;
                  local_b8.d.size = local_98.size;
                  local_98.size = qVar17;
                  if ((Function *)pDVar5 != (Function *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                    }
                  }
                }
                local_b8.d.d = (Data *)((ulong)local_b8.d.d & 0xffffffffffffff00);
                string.m_size = (qsizetype)&local_b8;
                string.m_data = (storage_type_conflict *)local_98.size;
                qVar18 = QString::toIntegral_helper(local_98.ptr,string,(bool *)0xa,(int)qVar15);
                if ((int)qVar18 != qVar18) {
                  local_b8.d.d = (Data *)((ulong)local_b8.d.d & 0xffffffffffffff00);
                  qVar18 = 0;
                }
                if (((char)local_b8.d.d == '\0') &&
                   (string_00.m_size = (qsizetype)&local_b8,
                   string_00.m_data = (storage_type_conflict *)local_98.size,
                   qVar18 = QString::toIntegral_helper
                                      (local_98.ptr,string_00,(bool *)0x10,(int)qVar15),
                   (int)qVar18 != qVar18)) {
                  local_b8.d.d = (Data *)((ulong)local_b8.d.d & 0xffffffffffffff00);
                  qVar18 = 0;
                }
                iVar12 = (int)qVar18;
                if ((char)local_b8.d.d == '\x01') {
LAB_0010a83d:
                  local_78._48_4_ = iVar12;
                  QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
                            ((QGenericArrayOps<EnumNameValue> *)&local_1f8,local_1f8.size,
                             (EnumNameValue *)local_78);
                  QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                  iVar11 = iVar12;
                }
                else {
                  iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1f8);
                  iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                  qVar17 = local_98.size;
                  pQVar25 = local_98.ptr;
                  lVar24 = ((long)iVar20.i - (long)iVar19.i >> 3) * 0x6db6db6db6db6db7 >> 2;
                  if (0 < lVar24) {
                    lVar24 = lVar24 + 1;
                    pEVar29 = iVar19.i + 2;
                    do {
                      iVar22.i = pEVar29;
                      psVar1 = (storage_type_conflict *)iVar22.i[-2].name.d.size;
                      if ((psVar1 == (storage_type_conflict *)qVar17) &&
                         (lhs_01.m_size = (qsizetype)pQVar25, lhs_01.m_data = psVar1,
                         rhs_01.m_size = qVar15, rhs_01.m_data = (storage_type_conflict *)qVar17,
                         bVar9 = QtPrivate::equalStrings
                                           ((QtPrivate *)iVar22.i[-2].name.d.ptr,lhs_01,rhs_01),
                         bVar9)) {
                        iVar22.i = iVar22.i + -2;
                        goto LAB_0010a81e;
                      }
                      psVar1 = (storage_type_conflict *)iVar22.i[-1].name.d.size;
                      if ((psVar1 == (storage_type_conflict *)qVar17) &&
                         (lhs_02.m_size = (qsizetype)pQVar25, lhs_02.m_data = psVar1,
                         rhs_02.m_size = qVar15, rhs_02.m_data = (storage_type_conflict *)qVar17,
                         bVar9 = QtPrivate::equalStrings
                                           ((QtPrivate *)iVar22.i[-1].name.d.ptr,lhs_02,rhs_02),
                         bVar9)) {
                        iVar22.i = iVar22.i + -1;
                        goto LAB_0010a81e;
                      }
                      psVar1 = (storage_type_conflict *)((iVar22.i)->name).d.size;
                      if ((psVar1 == (storage_type_conflict *)qVar17) &&
                         (lhs_03.m_size = (qsizetype)pQVar25, lhs_03.m_data = psVar1,
                         rhs_03.m_size = qVar15, rhs_03.m_data = (storage_type_conflict *)qVar17,
                         bVar9 = QtPrivate::equalStrings
                                           ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_03,rhs_03),
                         bVar9)) goto LAB_0010a81e;
                      psVar1 = (storage_type_conflict *)iVar22.i[1].name.d.size;
                      if ((psVar1 == (storage_type_conflict *)qVar17) &&
                         (lhs_04.m_size = (qsizetype)pQVar25, lhs_04.m_data = psVar1,
                         rhs_04.m_size = qVar15, rhs_04.m_data = (storage_type_conflict *)qVar17,
                         bVar9 = QtPrivate::equalStrings
                                           ((QtPrivate *)iVar22.i[1].name.d.ptr,lhs_04,rhs_04),
                         bVar9)) {
                        iVar22.i = iVar22.i + 1;
                        goto LAB_0010a81e;
                      }
                      lVar24 = lVar24 + -1;
                      pEVar29 = iVar22.i + 4;
                    } while (1 < lVar24);
                    iVar19.i = iVar22.i + 2;
                  }
                  lVar24 = ((long)iVar20.i - (long)iVar19.i >> 3) * 0x6db6db6db6db6db7;
                  if (lVar24 == 1) {
LAB_0010a7d1:
                    psVar1 = (storage_type_conflict *)((iVar19.i)->name).d.size;
                    iVar22 = iVar20;
                    if ((psVar1 == (storage_type_conflict *)local_98.size) &&
                       (lhs_07.m_size = (qsizetype)local_98.ptr, lhs_07.m_data = psVar1,
                       rhs_07.m_size = qVar15,
                       rhs_07.m_data = (storage_type_conflict *)local_98.size,
                       bVar9 = QtPrivate::equalStrings
                                         ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_07,rhs_07),
                       bVar9)) {
                      iVar22.i = iVar19.i;
                    }
                  }
                  else {
                    iVar22.i = iVar19.i;
                    if (lVar24 == 2) {
LAB_0010a7a2:
                      psVar1 = (storage_type_conflict *)((iVar22.i)->name).d.size;
                      if ((psVar1 != (storage_type_conflict *)local_98.size) ||
                         (lhs_06.m_size = (qsizetype)local_98.ptr, lhs_06.m_data = psVar1,
                         rhs_06.m_size = qVar15,
                         rhs_06.m_data = (storage_type_conflict *)local_98.size,
                         bVar9 = QtPrivate::equalStrings
                                           ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_06,rhs_06),
                         !bVar9)) {
                        iVar19.i = iVar22.i + 1;
                        goto LAB_0010a7d1;
                      }
                    }
                    else {
                      iVar22 = iVar20;
                      if ((lVar24 == 3) &&
                         ((psVar1 = (storage_type_conflict *)((iVar19.i)->name).d.size,
                          psVar1 != (storage_type_conflict *)local_98.size ||
                          (lhs_05.m_size = (qsizetype)local_98.ptr, lhs_05.m_data = psVar1,
                          rhs_05.m_size = qVar15,
                          rhs_05.m_data = (storage_type_conflict *)local_98.size,
                          bVar9 = QtPrivate::equalStrings
                                            ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_05,rhs_05),
                          iVar22.i = iVar19.i, !bVar9)))) {
                        iVar22.i = iVar19.i + 1;
                        goto LAB_0010a7a2;
                      }
                    }
                  }
LAB_0010a81e:
                  iVar19 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                  if (iVar22.i != iVar19.i) {
                    iVar12 = (iVar22.i)->value;
                    goto LAB_0010a83d;
                  }
                }
                if ((Function *)local_98.d != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
                }
              }
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              aVar28.m_data = aVar28.m_data + 0x18;
            } while ((Parser *)aVar28.m_data != pPVar27);
            if ((local_178.size != 0) && (1 < (ulong)local_178.size)) {
              uVar13 = 0;
              do {
                iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1f8);
                iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                if (iVar19.i == iVar20.i) {
LAB_0010ae4f:
                  parseMetadata();
                }
                else {
                  lVar24 = uVar13 * 2 + 1;
                  bVar9 = false;
                  do {
                    pQVar21 = QList<QString>::data((QList<QString> *)&local_178);
                    psVar1 = (storage_type_conflict *)((iVar19.i)->name).d.size;
                    psVar2 = (storage_type_conflict *)pQVar21[uVar13 * 2].d.size;
                    if (psVar1 == psVar2) {
                      lhs_08.m_size = (qsizetype)pQVar21[uVar13 * 2].d.ptr;
                      lhs_08.m_data = psVar1;
                      rhs_08.m_size = qVar15;
                      rhs_08.m_data = psVar2;
                      bVar10 = QtPrivate::equalStrings
                                         ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_08,rhs_08);
                    }
                    else {
                      bVar10 = false;
                    }
                    if (bVar10 != false) {
                      pQVar21 = QList<QString>::data((QList<QString> *)&local_178);
                      data_00 = &(pQVar21[lVar24].d.d)->super_QArrayData;
                      pcVar3 = pQVar21[lVar24].d.ptr;
                      psVar1 = (storage_type_conflict *)pQVar21[lVar24].d.size;
                      if (data_00 != (QArrayData *)0x0) {
                        LOCK();
                        (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
                             (data_00->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                      iVar22 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1f8);
                      iVar23 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                      lVar26 = ((long)iVar23.i - (long)iVar22.i >> 3) * 0x6db6db6db6db6db7 >> 2;
                      if (0 < lVar26) {
                        lVar26 = lVar26 + 1;
                        pEVar29 = iVar22.i + 2;
                        do {
                          iVar30.i = pEVar29;
                          psVar2 = (storage_type_conflict *)iVar30.i[-2].name.d.size;
                          if ((psVar2 == psVar1) &&
                             (lhs_09.m_size = (qsizetype)pcVar3, lhs_09.m_data = psVar2,
                             rhs_09.m_size = qVar15, rhs_09.m_data = psVar1,
                             bVar9 = QtPrivate::equalStrings
                                               ((QtPrivate *)iVar30.i[-2].name.d.ptr,lhs_09,rhs_09),
                             bVar9)) {
                            iVar30.i = iVar30.i + -2;
                            goto LAB_0010ac21;
                          }
                          psVar2 = (storage_type_conflict *)iVar30.i[-1].name.d.size;
                          if ((psVar2 == psVar1) &&
                             (lhs_10.m_size = (qsizetype)pcVar3, lhs_10.m_data = psVar2,
                             rhs_10.m_size = qVar15, rhs_10.m_data = psVar1,
                             bVar9 = QtPrivate::equalStrings
                                               ((QtPrivate *)iVar30.i[-1].name.d.ptr,lhs_10,rhs_10),
                             bVar9)) {
                            iVar30.i = iVar30.i + -1;
                            goto LAB_0010ac21;
                          }
                          psVar2 = (storage_type_conflict *)((iVar30.i)->name).d.size;
                          if ((psVar2 == psVar1) &&
                             (lhs_11.m_size = (qsizetype)pcVar3, lhs_11.m_data = psVar2,
                             rhs_11.m_size = qVar15, rhs_11.m_data = psVar1,
                             bVar9 = QtPrivate::equalStrings
                                               ((QtPrivate *)((iVar30.i)->name).d.ptr,lhs_11,rhs_11)
                             , bVar9)) goto LAB_0010ac21;
                          psVar2 = (storage_type_conflict *)iVar30.i[1].name.d.size;
                          if ((psVar2 == psVar1) &&
                             (lhs_12.m_size = (qsizetype)pcVar3, lhs_12.m_data = psVar2,
                             rhs_12.m_size = qVar15, rhs_12.m_data = psVar1,
                             bVar9 = QtPrivate::equalStrings
                                               ((QtPrivate *)iVar30.i[1].name.d.ptr,lhs_12,rhs_12),
                             bVar9)) {
                            iVar30.i = iVar30.i + 1;
                            goto LAB_0010ac21;
                          }
                          lVar26 = lVar26 + -1;
                          pEVar29 = iVar30.i + 4;
                        } while (1 < lVar26);
                        iVar22.i = iVar30.i + 2;
                      }
                      lVar26 = ((long)iVar23.i - (long)iVar22.i >> 3) * 0x6db6db6db6db6db7;
                      if (lVar26 == 1) {
LAB_0010abda:
                        psVar2 = (storage_type_conflict *)((iVar22.i)->name).d.size;
                        iVar30 = iVar23;
                        if ((psVar2 == psVar1) &&
                           (lhs_15.m_size = (qsizetype)pcVar3, lhs_15.m_data = psVar2,
                           rhs_15.m_size = qVar15, rhs_15.m_data = psVar1,
                           bVar9 = QtPrivate::equalStrings
                                             ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_15,rhs_15),
                           bVar9)) {
                          iVar30.i = iVar22.i;
                        }
                      }
                      else if (lVar26 == 2) {
LAB_0010abb5:
                        psVar2 = (storage_type_conflict *)((iVar22.i)->name).d.size;
                        if ((psVar2 != psVar1) ||
                           (lhs_14.m_size = (qsizetype)pcVar3, lhs_14.m_data = psVar2,
                           rhs_14.m_size = qVar15, rhs_14.m_data = psVar1,
                           bVar9 = QtPrivate::equalStrings
                                             ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_14,rhs_14),
                           iVar30.i = iVar22.i, !bVar9)) {
                          iVar22.i = iVar22.i + 1;
                          goto LAB_0010abda;
                        }
                      }
                      else {
                        iVar30 = iVar23;
                        if ((lVar26 == 3) &&
                           ((psVar2 = (storage_type_conflict *)((iVar22.i)->name).d.size,
                            psVar2 != psVar1 ||
                            (lhs_13.m_size = (qsizetype)pcVar3, lhs_13.m_data = psVar2,
                            rhs_13.m_size = qVar15, rhs_13.m_data = psVar1,
                            bVar9 = QtPrivate::equalStrings
                                              ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_13,rhs_13),
                            iVar30.i = iVar22.i, !bVar9)))) {
                          iVar22.i = iVar22.i + 1;
                          goto LAB_0010abb5;
                        }
                      }
LAB_0010ac21:
                      iVar22 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
                      if (iVar30.i == iVar22.i) {
                        parseMetadata();
                      }
                      else {
                        local_210.d.d = (Data *)0x0;
                        local_210.d.ptr = L"RANGE(%1, %2 ... %3)";
                        local_210.d.size = 0x14;
                        a.m_size = ((iVar19.i)->name).d.size * 4 + 2;
                        a.field_0.m_data_utf16 = ((iVar19.i)->name).d.ptr;
                        QString::arg_impl(&local_b8,&local_210,a,0,(QChar)0x20);
                        QString::arg_impl((QString *)&local_98,&local_b8,(long)(iVar19.i)->value,0,
                                          10,(QChar)0x20);
                        qVar15 = 10;
                        QString::arg_impl((QString *)local_78,(QString *)&local_98,
                                          (long)(iVar30.i)->value,0,10,(QChar)0x20);
                        data_01 = (Function *)((iVar19.i)->valueStr).d.d;
                        aVar28 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
                                 ((iVar19.i)->valueStr).d.ptr;
                        ((iVar19.i)->valueStr).d.d = (Data *)local_78._0_8_;
                        ((iVar19.i)->valueStr).d.ptr = (char16_t *)local_78._8_8_;
                        psVar1 = (storage_type_conflict *)((iVar19.i)->valueStr).d.size;
                        ((iVar19.i)->valueStr).d.size = local_78._16_8_;
                        local_78._0_8_ = data_01;
                        local_78._8_8_ = aVar28;
                        local_78._16_8_ = psVar1;
                        if (data_01 != (Function *)0x0) {
                          LOCK();
                          ((__atomic_base<int> *)&(data_01->className).d.d)->_M_i =
                               ((__atomic_base<int> *)&(data_01->className).d.d)->_M_i + -1;
                          UNLOCK();
                          if (((__atomic_base<int> *)&(data_01->className).d.d)->_M_i == 0) {
                            QArrayData::deallocate((QArrayData *)data_01,2,0x10);
                          }
                        }
                        if ((Function *)local_98.d != (Function *)0x0) {
                          LOCK();
                          *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                               *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
                          UNLOCK();
                          if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
                            QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if ((Function *)local_b8.d.d != (Function *)0x0) {
                          LOCK();
                          *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                               *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
                          UNLOCK();
                          if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if (&(local_210.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_210.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_210.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_210.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                      }
                      bVar9 = true;
                      if (data_00 != (QArrayData *)0x0) {
                        LOCK();
                        (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
                             (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(data_00,2,0x10);
                        }
                      }
                    }
                    iVar19.i = iVar19.i + 1;
                  } while ((bVar10 | iVar19.i == iVar20.i) != 1);
                  if (!bVar9) goto LAB_0010ae4f;
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)local_178.size >> 1);
            }
            iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1f8);
            iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1f8);
            if (iVar19.i != iVar20.i) {
              uVar13 = ((long)iVar20.i - (long)iVar19.i >> 3) * 0x6db6db6db6db6db7;
              lVar24 = 0x3f;
              if (uVar13 != 0) {
                for (; uVar13 >> lVar24 == 0; lVar24 = lVar24 + -1) {
                }
              }
              std::
              __introsort_loop<QList<EnumNameValue>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                        (iVar19.i,iVar20.i,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
              if ((long)iVar20.i - (long)iVar19.i < 0x381) {
                std::
                __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                          (iVar19.i,iVar20.i);
              }
              else {
                pEVar29 = iVar19.i + 0x10;
                std::
                __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                          (iVar19.i,pEVar29);
                for (; pEVar29 != iVar20.i; pEVar29 = pEVar29 + 1) {
                  std::
                  __unguarded_linear_insert<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Val_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                            (pEVar29);
                }
              }
            }
            QList<QString>::clear((QList<QString> *)&local_1d8);
            if (local_1f8.size != 0) {
              iVar11 = (local_1f8.ptr)->value;
              pQVar25 = &(local_1f8.ptr)->valueStr;
              lVar24 = local_1f8.size * 0x38;
              do {
                local_78._0_8_ = (Function *)0x0;
                local_78._8_8_ = (Parser *)0x0;
                local_78._16_8_ = (storage_type_conflict *)0x0;
                if ((pQVar25->d).ptr == (char16_t *)0x0) {
                  if (*(int *)(pQVar25 + 1) == iVar11 + 1 && bVar8 == false) {
                    QString::operator=((QString *)local_78,(QString *)(pQVar25 + -1));
                  }
                  else {
                    local_210.d.d = (Data *)0x0;
                    local_210.d.ptr = L"%1 = %2";
                    local_210.d.size = 7;
                    a_00.m_size = (((EnumNameValue *)(pQVar25 + -1))->name).d.size * 4 + 2;
                    a_00.field_0.m_data_utf16 = (((EnumNameValue *)(pQVar25 + -1))->name).d.ptr;
                    QString::arg_impl(&local_b8,&local_210,a_00,0,(QChar)0x20);
                    QString::arg_impl((QString *)&local_98,&local_b8,(long)*(int *)(pQVar25 + 1),0,
                                      10,(QChar)0x20);
                    uVar7 = local_78._8_8_;
                    uVar6 = local_78._0_8_;
                    qVar15 = local_98.size;
                    pDVar5 = local_98.d;
                    local_98.d = (Data *)local_78._0_8_;
                    local_78._0_8_ = pDVar5;
                    local_78._8_8_ = local_98.ptr;
                    local_98.ptr = (QString *)uVar7;
                    local_98.size = local_78._16_8_;
                    local_78._16_8_ = qVar15;
                    if ((Function *)uVar6 != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)uVar6)->d).d = *(int *)&(((QString *)uVar6)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)uVar6)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                      }
                    }
                    if ((Function *)local_b8.d.d != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                           *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_210.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_210.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_210.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  iVar11 = *(int *)(pQVar25 + 1);
                }
                else {
                  QString::operator=((QString *)local_78,pQVar25);
                }
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)&local_1d8,local_1d8.size,
                           (QString *)local_78);
                QList<QString>::end((QList<QString> *)&local_1d8);
                if ((Function *)local_78._0_8_ != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_78._0_8_)->d).d =
                       *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                  }
                }
                pQVar25 = (QString *)&pQVar25[2].d.ptr;
                lVar24 = lVar24 + -0x38;
              } while (lVar24 != 0);
            }
            local_210.d.d = (Data *)0x0;
            local_210.d.ptr = L"%1 {\n %2 \n} %3;";
            local_210.d.size = 0xf;
            a_01.m_size = local_198.d.size * 4 + 2;
            a_01.field_0.m_data_utf16 = local_198.d.ptr;
            QString::arg_impl(&local_b8,&local_210,a_01,0,(QChar)0x20);
            QtPrivate::QStringList_join(local_258,(QStringList *)&local_1d8,(QChar *)L",\n",2);
            a_02.m_size = local_258[0].d.size * 4 + 2;
            a_02.field_0.m_data_utf16 = local_258[0].d.ptr;
            QString::arg_impl((QString *)&local_98,&local_b8,a_02,0,(QChar)0x20);
            qVar15 = 0;
            a_03.m_size = local_1b8.d.size * 4 + 2;
            a_03.field_0.m_data_utf16 = local_1b8.d.ptr;
            QString::arg_impl((QString *)local_78,(QString *)&local_98,a_03,0,(QChar)0x20);
            uVar7 = local_78._16_8_;
            uVar6 = local_78._0_8_;
            pcVar3 = local_d8.d.ptr;
            pDVar4 = local_d8.d.d;
            local_78._0_8_ = local_d8.d.d;
            local_d8.d.d = (Data *)uVar6;
            local_d8.d.ptr = (char16_t *)local_78._8_8_;
            local_78._8_8_ = pcVar3;
            local_78._16_8_ = local_d8.d.size;
            local_d8.d.size = uVar7;
            if ((Function *)pDVar4 != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&pDVar4->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
            if ((Function *)local_98.d != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_258[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_258[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_258[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_258[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate(&(local_258[0].d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Function *)local_b8.d.d != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_b8.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_210.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_210.d.d)->super_QArrayData,2,0x10);
              }
            }
            str_02.m_size = 1;
            str_02.m_data = (storage_type_conflict *)local_d8.d.size;
            bVar8 = QtPrivate::QStringList_contains
                              ((QtPrivate *)this_00,(QStringList *)local_d8.d.ptr,str_02,
                               (CaseSensitivity)qVar15);
            if (!bVar8) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)this_00,(this->m_metadata).d.size,&local_d8);
              QList<QString>::end(this_00);
            }
            QArrayDataPointer<EnumNameValue>::~QArrayDataPointer(&local_1f8);
          }
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_1d8);
          if ((Function *)local_1b8.d.d != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
            }
          }
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_178);
        }
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_2a0 = qVar16 + 1;
        QRegularExpressionMatch::~QRegularExpressionMatch(&local_130);
        bVar8 = QRegularExpressionMatchIterator::hasNext
                          ((QRegularExpressionMatchIterator *)&local_128);
      } while (bVar8);
    }
    if ((long)local_108 - local_2a0 != 0 && local_2a0 <= (long)local_108) {
      QString::mid((QString *)local_78,(QString *)(local_120 + 8),local_2a0,
                   (long)local_108 - local_2a0);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&this->m_metadata,(this->m_metadata).d.size,
                 (QString *)local_78);
      QList<QString>::end(&this->m_metadata);
      if ((Function *)local_78._0_8_ != (Function *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_78._0_8_)->d).d =
             *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_128);
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_120);
    if ((QArrayData *)local_120._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_120._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_120._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_120._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_120._8_8_,2,0x10);
      }
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Function *)local_d8.d.d != (Function *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_d8.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_d8.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_d8.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parseMetadata(const QString &data, qsizetype offset, const QStringList &includes)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    QString metadata;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    metadata = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: metadata: %s", qPrintable(metadata)));

    QString preprocessed = preprocessMetadata(metadata);

    DEBUGPRINTF2(printf("preprocessed %s\n", qPrintable(preprocessed)));

    QRegularExpression macro(QStringLiteral("([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;"));
    QRegularExpressionMatchIterator i = macro.globalMatch(preprocessed);
    qsizetype prev = 0;
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString values = match.captured(2).trimmed();
        int cur = match.capturedStart();
        if (cur > prev)
            m_metadata.append(preprocessed.mid(prev, cur - prev));

        prev = match.capturedEnd() + 1;
        DEBUGPRINTF2(printf("values: %s\n", qPrintable(values)));
        if (values.isEmpty() || values.startsWith(QStringLiteral("AUTO"))) {
            values.replace(QLatin1Char('\n'), QLatin1Char(' '));
            QStringList ranges;
            if (values.contains(QStringLiteral("RANGE"))) {
                QRegularExpression rangeMacro(QStringLiteral("RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)"));
                QRegularExpressionMatchIterator r = rangeMacro.globalMatch(values);
                while (r.hasNext()) {
                    QRegularExpressionMatch rm = r.next();
                    ranges << rm.captured(1);
                    ranges << rm.captured(2);
                    DEBUGPRINTF2(printf("range: %s ... %s\n", qPrintable(rm.captured(1)), qPrintable(rm.captured(2))));
                }
            }

            const auto enumOrFlag = match.captured(1);
            const auto name = match.captured(3);
            const bool flags = enumOrFlag == QStringLiteral("FLAGS");

            QStringList values = findEnumValues(name, includes);
            if (values.isEmpty()) {
                if (flags && name.endsWith(QLatin1Char('s')))
                    values = findEnumValues(name.left(name.length() - 1), includes);
                if (values.isEmpty()) {
                    DEBUGPRINTF(printf("Unable to find values for %s\n", qPrintable(name)));
                }
            }
            if (!values.isEmpty()) {
                auto moreValues = enumsToValues(values);
                if (ranges.size()) {
                    for (int i = 0; i < ranges.size() / 2; i++) {
                        bool rangeFound = false;
                        for (auto &v : moreValues) {
                            if (v.name == ranges[2 * i]) {
                                rangeFound = true;
                                QString rangeEnd = ranges[2 * i + 1];
                                auto iter = std::find_if(moreValues.begin(), moreValues.end(), [&rangeEnd](const EnumNameValue &elem){
                                    return elem.name == rangeEnd;
                                });
                                if (iter != moreValues.end())
                                    v.valueStr = QStringLiteral("RANGE(%1, %2 ... %3)").arg(v.name).arg(v.value).arg(iter->value);
                                else
                                    panic("Unable to find range end: %s\n", qPrintable(rangeEnd));
                                break;
                            }
                        }
                        if (rangeFound == false)
                            panic("Unable to find range begin: %s\n", qPrintable(ranges[2 * i]));
                    }
                }
                std::sort(moreValues.begin(), moreValues.end(), [](const EnumNameValue &a, const EnumNameValue &b) {
                    return a.value < b.value;
                });
                values.clear();
                int prevValue = std::as_const(moreValues).front().value;
                for (const auto &v : std::as_const(moreValues)) {
                    QString a;
                    if (v.valueStr.isNull()) {
                        if (v.value == prevValue + 1 && !flags)
                            a = v.name;
                        else
                            a = QStringLiteral("%1 = %2").arg(v.name).arg(v.value);
                        prevValue = v.value;
                    } else {
                        a = v.valueStr;
                    }
                    values << a;
                }

                metadata = QStringLiteral("%1 {\n %2 \n} %3;").arg(enumOrFlag).arg(values.join(QStringLiteral(",\n"))).arg(name);
                if (!m_metadata.contains(metadata))
                    m_metadata.append(metadata);
            }
        } else {
            if (!m_metadata.contains(match.captured()))
                m_metadata.append(match.captured());
        }
    }
    if (prev < preprocessed.length())
        m_metadata.append(preprocessed.mid(prev, preprocessed.length() - prev));
}